

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar11 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [64];
  undefined1 auVar15 [60];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar17;
  float n2;
  Vector3f VVar18;
  Point3f PVar19;
  Point3<float> PVar20;
  Bounds2f BVar21;
  Tuple3<pbrt::Vector3,_float> local_58;
  undefined1 local_48 [16];
  Tuple3<pbrt::Point3,_float> local_30;
  undefined1 auVar16 [56];
  
  auVar15 = in_ZMM1._4_60_;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_58.z = 1.0;
  auVar11 = (undefined1  [56])0x0;
  VVar18 = CameraTransform::RenderFromCamera
                     ((CameraTransform *)this,(Vector3f *)&local_58,ray->time);
  auVar12._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._4_60_ = auVar15;
  auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar11;
  auVar5 = vmovshdup_avx(auVar6._0_16_);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ *
                                         (ray->d).super_Tuple3<pbrt::Vector3,_float>.y)),
                           auVar6._0_16_,
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
  auVar5 = vfmadd231ss_fma(auVar5,auVar12._0_16_,
                           ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.z));
  fVar17 = auVar5._0_4_;
  if (this->cosTotalWidth < fVar17) {
    auVar5._0_12_ = ZEXT812(0);
    auVar5._12_4_ = 0;
    uVar3 = vcmpss_avx512f(auVar5,ZEXT416((uint)(this->super_ProjectiveCamera).lensRadius),1);
    bVar4 = (bool)((byte)uVar3 & 1);
    auVar11 = ZEXT856(0);
    PVar19 = Ray::operator()(ray,(float)((uint)bVar4 *
                                         (int)(this->super_ProjectiveCamera).focalDistance +
                                        (uint)!bVar4 * 0x3f800000) / fVar17);
    auVar15 = auVar12._4_60_;
    local_58.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar7._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar11;
    local_58._0_8_ = vmovlps_avx(auVar7._0_16_);
    auVar11 = (undefined1  [56])0x0;
    PVar19 = CameraTransform::CameraFromRender
                       ((CameraTransform *)this,(Point3f *)&local_58,ray->time);
    local_30.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
    auVar8._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar8._8_56_ = auVar11;
    local_30._0_8_ = vmovlps_avx(auVar8._0_16_);
    PVar20 = Transform::ApplyInverse<float>
                       (&(this->super_ProjectiveCamera).cameraFromRaster,(Point3<float> *)&local_30)
    ;
    auVar13._0_4_ = PVar20.super_Tuple3<pbrt::Point3,_float>.z;
    auVar13._4_60_ = auVar15;
    auVar16 = auVar15._4_56_;
    auVar9._0_8_ = PVar20.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar11;
    local_48 = auVar9._0_16_;
    BVar21 = TaggedPointer<pbrt::RGBFilm,pbrt::GBufferFilm>::
             Dispatch<pbrt::FilmHandle::SampleBounds()const::_lambda(auto:1)_1_>
                       (auVar9._0_8_,auVar13._0_8_,
                        &(this->super_ProjectiveCamera).super_CameraBase.film);
    auVar14._0_8_ = BVar21.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar14._8_56_ = auVar16;
    auVar10._0_8_ = BVar21.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar10._8_56_ = auVar11;
    auVar5 = vmovlhps_avx(local_48,auVar10._0_16_);
    auVar2 = vmovlhps_avx(auVar14._0_16_,local_48);
    uVar3 = vcmpps_avx512vl(auVar5,auVar2,2);
    if ((char)uVar3 == '\x0f') {
      fVar1 = (this->super_ProjectiveCamera).lensRadius;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416(0),4);
      bVar4 = (bool)((byte)uVar3 & 1);
      *pdfPos = (Float)((uint)bVar4 * (int)(1.0 / (fVar1 * fVar1 * 3.1415927)) +
                       (uint)!bVar4 * 0x3f800000);
      *pdfDir = 1.0 / (fVar17 * fVar17 * fVar17 * this->A);
      return;
    }
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}